

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

char * cmsys::SystemTools::GetEnvImpl(char *key)

{
  char *pcVar1;
  
  pcVar1 = getenv(key);
  return pcVar1;
}

Assistant:

const char* SystemTools::GetEnvImpl(const char* key)
{
  const char* v = 0;
#if defined(_WIN32)
  std::string env;
  if (SystemTools::GetEnv(key, env)) {
    std::string& menv = (*SystemTools::EnvMap)[key];
    menv = env;
    v = menv.c_str();
  }
#else
  v = getenv(key);
#endif
  return v;
}